

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void * google::protobuf::internal::CreateSplitMessageGeneric
                 (Arena *arena,void *default_split,size_t size,void *message,void *default_message)

{
  void *pvVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (message == default_message) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (message,default_message,"message != default_message");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (arena == (Arena *)0x0) {
      pvVar1 = operator_new(size);
    }
    else {
      pvVar1 = Arena::Allocate(arena,size + 7 & 0xfffffffffffffff8);
    }
    pvVar1 = memcpy(pvVar1,default_split,size);
    return pvVar1;
  }
  CreateSplitMessageGeneric();
}

Assistant:

void* CreateSplitMessageGeneric(Arena* arena, const void* default_split,
                                size_t size, const void* message,
                                const void* default_message) {
  ABSL_DCHECK_NE(message, default_message);
  void* split =
      (arena == nullptr) ? ::operator new(size) : arena->AllocateAligned(size);
  memcpy(split, default_split, size);
  return split;
}